

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O1

int __thiscall cmCPackGenerator::PrepareGroupingKind(cmCPackGenerator *this)

{
  pointer pcVar1;
  cmCPackLog *pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  ostream *poVar6;
  size_t sVar7;
  ComponentPackageMethod CVar8;
  ComponentPackageMethod CVar9;
  string groupingType;
  ostringstream cmCPackLog_msg;
  long *local_1e8;
  long local_1d8 [2];
  char *local_1c8;
  char *local_1c0;
  char local_1b8;
  undefined7 uStack_1b7;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar1 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_COMPONENTS_ALL_IN_ONE_PACKAGE","");
  pcVar4 = GetOption(this,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_COMPONENTS_IGNORE_GROUPS","");
  pcVar5 = GetOption(this,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  CVar9 = ONE_PACKAGE_PER_COMPONENT;
  if (pcVar5 == (char *)0x0) {
    CVar9 = (uint)(pcVar4 == (char *)0x0) * 3;
  }
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_COMPONENTS_ONE_PACKAGE_PER_GROUP","");
  pcVar4 = GetOption(this,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  CVar8 = ONE_PACKAGE_PER_GROUP;
  if (pcVar4 == (char *)0x0) {
    CVar8 = CVar9;
  }
  local_1c8 = &local_1b8;
  local_1c0 = (char *)0x0;
  local_1b8 = '\0';
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_COMPONENTS_GROUPING","");
  pcVar4 = GetOption(this,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar4 != (char *)0x0) {
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CPACK_COMPONENTS_GROUPING","");
    pcVar5 = GetOption(this,(string *)local_1a8);
    pcVar4 = local_1c0;
    strlen(pcVar5);
    std::__cxx11::string::_M_replace((ulong)&local_1c8,0,pcVar4,(ulong)pcVar5);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  if (local_1c0 != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(this->Name)._M_dataplus._M_p,
                        (this->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," requested component grouping = ",0x20);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_1c8,(long)local_1c0);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    pcVar2 = this->Logger;
    std::__cxx11::stringbuf::str();
    sVar7 = strlen((char *)local_1e8);
    cmCPackLog::Log(pcVar2,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x55b,(char *)local_1e8,sVar7);
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    iVar3 = std::__cxx11::string::compare((char *)&local_1c8);
    if (iVar3 == 0) {
      CVar8 = ONE_PACKAGE;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_1c8);
      if (iVar3 == 0) {
        CVar8 = ONE_PACKAGE_PER_COMPONENT;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_1c8);
        if (iVar3 == 0) {
          CVar8 = ONE_PACKAGE_PER_GROUP;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(this->Name)._M_dataplus._M_p,
                              (this->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," requested component grouping type <",0x24);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_1c8,(long)local_1c0);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"> UNKNOWN not in (ALL_COMPONENTS_IN_ONE,IGNORE,ONE_PER_GROUP)",0x3d);
          std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          pcVar2 = this->Logger;
          std::__cxx11::stringbuf::str();
          sVar7 = strlen((char *)local_1e8);
          cmCPackLog::Log(pcVar2,8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x56e,(char *)local_1e8,sVar7);
          if (local_1e8 != local_1d8) {
            operator_delete(local_1e8,local_1d8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
      }
    }
  }
  if (((CVar8 == ONE_PACKAGE_PER_GROUP) &&
      (CVar8 = ONE_PACKAGE_PER_GROUP,
      (this->ComponentGroups)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
     ((this->Components)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    CVar9 = this->componentPackageMethod;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(this->Name)._M_dataplus._M_p,
                        (this->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," One package per component group requested, ",0x2c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"but NO component groups exist: Ignoring component group.",0x38);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    pcVar2 = this->Logger;
    std::__cxx11::stringbuf::str();
    sVar7 = strlen((char *)local_1e8);
    cmCPackLog::Log(pcVar2,8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x583,(char *)local_1e8,sVar7);
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    CVar8 = (ComponentPackageMethod)(CVar9 != ONE_PACKAGE);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if (CVar8 != UNKNOWN_COMPONENT_PACKAGE_METHOD) {
    this->componentPackageMethod = CVar8;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(this->Name)._M_dataplus._M_p,
                      (this->Name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," requested component grouping = ",0x20)
  ;
  pcVar4 = *(char **)(&DAT_005f7770 + (ulong)this->componentPackageMethod * 8);
  sVar7 = strlen(pcVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar7);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  pcVar2 = this->Logger;
  std::__cxx11::stringbuf::str();
  sVar7 = strlen((char *)local_1e8);
  cmCPackLog::Log(pcVar2,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x597,(char *)local_1e8,sVar7);
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  return 1;
}

Assistant:

int cmCPackGenerator::PrepareGroupingKind()
{
  // find a component package method specified by the user
  ComponentPackageMethod method = UNKNOWN_COMPONENT_PACKAGE_METHOD;

  if(this->GetOption("CPACK_COMPONENTS_ALL_IN_ONE_PACKAGE"))
    {
    method = ONE_PACKAGE;
    }

  if(this->GetOption("CPACK_COMPONENTS_IGNORE_GROUPS"))
    {
    method = ONE_PACKAGE_PER_COMPONENT;
    }

  if(this->GetOption("CPACK_COMPONENTS_ONE_PACKAGE_PER_GROUP"))
    {
    method = ONE_PACKAGE_PER_GROUP;
    }

  std::string groupingType;

  // Second way to specify grouping
  if (NULL != this->GetOption("CPACK_COMPONENTS_GROUPING")) {
     groupingType = this->GetOption("CPACK_COMPONENTS_GROUPING");
  }

  if (!groupingType.empty())
    {
    cmCPackLogger(cmCPackLog::LOG_VERBOSE,  "["
        << this->Name << "]"
        << " requested component grouping = "<< groupingType <<std::endl);
    if (groupingType == "ALL_COMPONENTS_IN_ONE")
      {
      method = ONE_PACKAGE;
      }
    else if (groupingType == "IGNORE")
      {
      method = ONE_PACKAGE_PER_COMPONENT;
      }
    else if (groupingType == "ONE_PER_GROUP")
      {
      method = ONE_PACKAGE_PER_GROUP;
      }
    else
      {
      cmCPackLogger(cmCPackLog::LOG_WARNING, "["
          << this->Name << "]"
          << " requested component grouping type <"<< groupingType
          << "> UNKNOWN not in (ALL_COMPONENTS_IN_ONE,IGNORE,ONE_PER_GROUP)"
          << std::endl);
      }
    }

  // Some components were defined but NO group
  // fallback to default if not group based
  if(method == ONE_PACKAGE_PER_GROUP &&
     this->ComponentGroups.empty() && !this->Components.empty())
    {
    if(componentPackageMethod == ONE_PACKAGE)
      {
      method = ONE_PACKAGE;
      }
    else
      {
      method = ONE_PACKAGE_PER_COMPONENT;
      }
    cmCPackLogger(cmCPackLog::LOG_WARNING, "["
         << this->Name << "]"
         << " One package per component group requested, "
         << "but NO component groups exist: Ignoring component group."
         << std::endl);
    }

  // if user specified packaging method, override the default packaging method
  if(method != UNKNOWN_COMPONENT_PACKAGE_METHOD)
    {
    componentPackageMethod = method;
    }

  const char* method_names[] =
    {
    "ALL_COMPONENTS_IN_ONE",
    "IGNORE_GROUPS",
    "ONE_PER_GROUP"
    };

  cmCPackLogger(cmCPackLog::LOG_VERBOSE,  "["
        << this->Name << "]"
        << " requested component grouping = "
        << method_names[componentPackageMethod]
        << std::endl);

  return 1;
}